

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ml_avx2.c
# Opt level: O3

void av1_nn_predict_avx2(float *input_nodes,NN_CONFIG *nn_config,int reduce_prec,float *output)

{
  float *pfVar1;
  undefined1 auVar2 [32];
  __m128 afVar3;
  __m128 afVar4;
  undefined1 auVar5 [32];
  uint num_inputs;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  bool bVar24;
  float *pfVar25;
  int iVar26;
  float *pfVar27;
  int *piVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  float *pfVar34;
  undefined1 (*pauVar35) [32];
  bool bVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  float *pfVar45;
  bool bVar46;
  bool bVar47;
  undefined1 auVar49 [16];
  float fVar48;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  __m256 hadd [4];
  float buf [2] [128];
  float *local_590;
  float *local_588;
  __m128 local_540;
  undefined1 auStack_530 [16];
  int local_510;
  int local_50c;
  float *local_508;
  __m128 local_500;
  undefined1 auStack_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  int *local_478;
  int *local_470;
  NN_CONFIG *local_468;
  float local_460 [268];
  
  uVar31 = (ulong)(uint)nn_config->num_hidden_layers;
  local_510 = reduce_prec;
  local_508 = output;
  if (-1 < nn_config->num_hidden_layers) {
    local_470 = &nn_config->num_outputs;
    local_478 = nn_config->num_hidden_nodes;
    uVar32 = 0;
    uVar38 = 0;
    uVar30 = (ulong)(uint)nn_config->num_inputs;
    local_590 = input_nodes;
    local_468 = nn_config;
    do {
      pfVar25 = local_468->weights[uVar38];
      local_588 = local_468->bias[uVar38];
      uVar31 = uVar31 & 0xffffffff;
      local_50c = (int)uVar32;
      pfVar27 = local_460 + uVar32 * 0x80;
      if (uVar38 == uVar31) {
        pfVar27 = local_508;
      }
      piVar28 = local_478 + uVar38;
      if (uVar38 == uVar31) {
        piVar28 = local_470;
      }
      uVar37 = *piVar28;
      uVar41 = (ulong)uVar37;
      num_inputs = (uint)uVar30;
      uVar39 = num_inputs;
      if ((int)num_inputs < 0) {
        uVar39 = num_inputs + 7;
      }
      uVar33 = (int)num_inputs % 8;
      if (uVar33 == 0) {
        if ((uVar37 & 7) == 0) {
          if (0 < (int)uVar37) {
            iVar44 = 0;
            uVar30 = 0;
            do {
              pfVar34 = local_588 + uVar30;
              fVar48 = *pfVar34;
              fVar6 = pfVar34[1];
              fVar7 = pfVar34[2];
              fVar8 = pfVar34[3];
              fVar9 = pfVar34[4];
              fVar10 = pfVar34[5];
              fVar11 = pfVar34[6];
              fVar12 = pfVar34[7];
              auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar60 = ZEXT1632(ZEXT816(0) << 0x40);
              if (0 < (int)num_inputs) {
                lVar29 = 0;
                iVar26 = iVar44;
                do {
                  pfVar34 = local_590 + lVar29;
                  fVar13 = *pfVar34;
                  fVar14 = pfVar34[1];
                  fVar15 = pfVar34[2];
                  fVar16 = pfVar34[3];
                  fVar17 = pfVar34[4];
                  fVar18 = pfVar34[5];
                  fVar19 = pfVar34[6];
                  lVar40 = 0;
                  iVar42 = iVar26;
                  do {
                    pfVar34 = pfVar25 + iVar42;
                    auVar62._0_4_ = fVar13 * *pfVar34;
                    auVar62._4_4_ = fVar14 * pfVar34[1];
                    auVar62._8_4_ = fVar15 * pfVar34[2];
                    auVar62._12_4_ = fVar16 * pfVar34[3];
                    auVar62._16_4_ = fVar17 * pfVar34[4];
                    auVar62._20_4_ = fVar18 * pfVar34[5];
                    auVar62._28_36_ = in_ZMM3._28_36_;
                    auVar62._24_4_ = fVar19 * pfVar34[6];
                    pfVar34 = pfVar25 + (int)(num_inputs + iVar42);
                    auVar65._0_4_ = fVar13 * *pfVar34;
                    auVar65._4_4_ = fVar14 * pfVar34[1];
                    auVar65._8_4_ = fVar15 * pfVar34[2];
                    auVar65._12_4_ = fVar16 * pfVar34[3];
                    auVar65._16_4_ = fVar17 * pfVar34[4];
                    auVar65._20_4_ = fVar18 * pfVar34[5];
                    auVar65._28_36_ = in_ZMM4._28_36_;
                    auVar65._24_4_ = fVar19 * pfVar34[6];
                    in_ZMM4 = ZEXT3264(auVar65._0_32_);
                    auVar60 = vhaddps_avx(auVar62._0_32_,auVar65._0_32_);
                    in_ZMM3 = ZEXT3264(auVar60);
                    *(undefined1 (*) [32])((long)local_500 + lVar40) = auVar60;
                    iVar42 = iVar42 + num_inputs * 2;
                    lVar40 = lVar40 + 0x20;
                  } while (lVar40 != 0x80);
                  auVar2._16_16_ = auStack_4f0;
                  auVar2._0_4_ = local_500[0];
                  auVar2._4_4_ = local_500[1];
                  auVar2._8_4_ = local_500[2];
                  auVar2._12_4_ = local_500[3];
                  auVar2 = vhaddps_avx(auVar2,local_4e0);
                  auVar55 = vhaddps_avx(local_4c0,local_4a0);
                  in_ZMM3 = ZEXT3264(auVar55);
                  in_ZMM4 = ZEXT3264(CONCAT1616(auVar55._0_16_,auVar2._0_16_));
                  auVar5 = vperm2f128_avx(auVar2,auVar55,0x31);
                  auVar60._0_4_ = auVar57._0_4_ + auVar2._0_4_ + auVar5._0_4_;
                  auVar60._4_4_ = auVar57._4_4_ + auVar2._4_4_ + auVar5._4_4_;
                  auVar60._8_4_ = auVar57._8_4_ + auVar2._8_4_ + auVar5._8_4_;
                  auVar60._12_4_ = auVar57._12_4_ + auVar2._12_4_ + auVar5._12_4_;
                  auVar60._16_4_ = auVar57._16_4_ + auVar55._0_4_ + auVar5._16_4_;
                  auVar60._20_4_ = auVar57._20_4_ + auVar55._4_4_ + auVar5._20_4_;
                  auVar60._24_4_ = auVar57._24_4_ + auVar55._8_4_ + auVar5._24_4_;
                  auVar60._28_4_ = auVar57._28_4_ + auVar55._12_4_ + auVar5._28_4_;
                  auVar57 = ZEXT3264(auVar60);
                  lVar29 = lVar29 + 8;
                  iVar26 = iVar26 + 8;
                } while (lVar29 < (int)num_inputs);
              }
              auVar55._0_4_ = fVar48 + auVar60._0_4_;
              auVar55._4_4_ = fVar6 + auVar60._4_4_;
              auVar55._8_4_ = fVar7 + auVar60._8_4_;
              auVar55._12_4_ = fVar8 + auVar60._12_4_;
              auVar55._16_4_ = fVar9 + auVar60._16_4_;
              auVar55._20_4_ = fVar10 + auVar60._20_4_;
              auVar55._24_4_ = fVar11 + auVar60._24_4_;
              auVar55._28_4_ = fVar12 + auVar60._28_4_;
              if (uVar38 != uVar31) {
                auVar55 = vmaxps_avx(auVar55,_DAT_00517b80);
              }
              *(undefined1 (*) [32])(pfVar27 + uVar30) = auVar55;
              uVar30 = uVar30 + 8;
              iVar44 = iVar44 + num_inputs * 8;
            } while (uVar30 < uVar41);
          }
        }
        else if ((uVar37 & 3) == 0) {
          if (0 < (int)uVar37) {
            uVar30 = 0;
            do {
              pfVar34 = local_588 + uVar30;
              fVar48 = *pfVar34;
              fVar6 = pfVar34[1];
              fVar7 = pfVar34[2];
              fVar8 = pfVar34[3];
              auVar58 = ZEXT816(0) << 0x40;
              if (0 < (int)num_inputs) {
                lVar29 = 0;
                auVar51 = auVar58;
                do {
                  pfVar34 = local_590 + lVar29;
                  fVar9 = *pfVar34;
                  fVar10 = pfVar34[1];
                  fVar11 = pfVar34[2];
                  fVar12 = pfVar34[3];
                  fVar13 = pfVar34[4];
                  fVar14 = pfVar34[5];
                  fVar15 = pfVar34[6];
                  uVar37 = 0;
                  pauVar35 = (undefined1 (*) [32])local_500;
                  bVar46 = true;
                  do {
                    bVar47 = bVar46;
                    iVar44 = (uVar37 | (uint)uVar30) * num_inputs + (int)lVar29;
                    pfVar34 = pfVar25 + iVar44;
                    auVar57._0_4_ = fVar9 * *pfVar34;
                    auVar57._4_4_ = fVar10 * pfVar34[1];
                    auVar57._8_4_ = fVar11 * pfVar34[2];
                    auVar57._12_4_ = fVar12 * pfVar34[3];
                    auVar57._16_4_ = fVar13 * pfVar34[4];
                    auVar57._20_4_ = fVar14 * pfVar34[5];
                    auVar57._28_36_ = in_ZMM3._28_36_;
                    auVar57._24_4_ = fVar15 * pfVar34[6];
                    pfVar34 = pfVar25 + (int)(iVar44 + num_inputs);
                    auVar67._0_4_ = fVar9 * *pfVar34;
                    auVar67._4_4_ = fVar10 * pfVar34[1];
                    auVar67._8_4_ = fVar11 * pfVar34[2];
                    auVar67._12_4_ = fVar12 * pfVar34[3];
                    auVar67._16_4_ = fVar13 * pfVar34[4];
                    auVar67._20_4_ = fVar14 * pfVar34[5];
                    auVar67._28_36_ = in_ZMM4._28_36_;
                    auVar67._24_4_ = fVar15 * pfVar34[6];
                    in_ZMM4 = ZEXT3264(auVar67._0_32_);
                    auVar60 = vhaddps_avx(auVar57._0_32_,auVar67._0_32_);
                    in_ZMM3 = ZEXT3264(auVar60);
                    *pauVar35 = auVar60;
                    uVar37 = 2;
                    pauVar35 = (undefined1 (*) [32])local_540;
                    bVar46 = false;
                  } while (bVar47);
                  auVar22._16_16_ = auStack_4f0;
                  auVar22._0_4_ = local_500[0];
                  auVar22._4_4_ = local_500[1];
                  auVar22._8_4_ = local_500[2];
                  auVar22._12_4_ = local_500[3];
                  auVar5._16_16_ = auStack_530;
                  auVar5._0_4_ = local_540[0];
                  auVar5._4_4_ = local_540[1];
                  auVar5._8_4_ = local_540[2];
                  auVar5._12_4_ = local_540[3];
                  auVar60 = vhaddps_avx(auVar22,auVar5);
                  in_ZMM3 = ZEXT1664(auVar60._16_16_);
                  auVar58._0_4_ = auVar51._0_4_ + auVar60._0_4_ + auVar60._16_4_;
                  auVar58._4_4_ = auVar51._4_4_ + auVar60._4_4_ + auVar60._20_4_;
                  auVar58._8_4_ = auVar51._8_4_ + auVar60._8_4_ + auVar60._24_4_;
                  auVar58._12_4_ = auVar51._12_4_ + auVar60._12_4_ + auVar60._28_4_;
                  lVar29 = lVar29 + 8;
                  auVar51 = auVar58;
                } while (lVar29 < (int)num_inputs);
              }
              auVar51._0_4_ = fVar48 + auVar58._0_4_;
              auVar51._4_4_ = fVar6 + auVar58._4_4_;
              auVar51._8_4_ = fVar7 + auVar58._8_4_;
              auVar51._12_4_ = fVar8 + auVar58._12_4_;
              if (uVar38 != uVar31) {
                auVar51 = vmaxps_avx(auVar51,_DAT_004c9010);
              }
              *(undefined1 (*) [16])(pfVar27 + uVar30) = auVar51;
              uVar30 = uVar30 + 4;
            } while (uVar30 < uVar41);
          }
        }
        else if (0 < (int)uVar37) {
          uVar30 = 0;
          do {
            auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar53 = ZEXT1632(ZEXT816(0) << 0x40);
            if (0 < (int)num_inputs) {
              lVar29 = 0;
              do {
                pfVar34 = local_590 + lVar29;
                pfVar45 = pfVar25 + lVar29;
                auVar53._0_4_ = auVar57._0_4_ + *pfVar34 * *pfVar45;
                auVar53._4_4_ = auVar57._4_4_ + pfVar34[1] * pfVar45[1];
                auVar53._8_4_ = auVar57._8_4_ + pfVar34[2] * pfVar45[2];
                auVar53._12_4_ = auVar57._12_4_ + pfVar34[3] * pfVar45[3];
                auVar53._16_4_ = auVar57._16_4_ + pfVar34[4] * pfVar45[4];
                auVar53._20_4_ = auVar57._20_4_ + pfVar34[5] * pfVar45[5];
                auVar53._24_4_ = auVar57._24_4_ + pfVar34[6] * pfVar45[6];
                auVar53._28_4_ = auVar57._28_4_ + pfVar34[7];
                auVar57 = ZEXT3264(auVar53);
                lVar29 = lVar29 + 8;
              } while (lVar29 < (int)num_inputs);
            }
            auVar49._0_4_ = auVar53._0_4_ + auVar53._16_4_;
            auVar49._4_4_ = auVar53._4_4_ + auVar53._20_4_;
            auVar49._8_4_ = auVar53._8_4_ + auVar53._24_4_;
            auVar49._12_4_ = auVar53._12_4_ + auVar53._28_4_;
            auVar58 = vhaddps_avx(auVar49,auVar49);
            auVar58 = vhaddps_avx(auVar58,auVar58);
            fVar48 = auVar58._0_4_ + local_588[uVar30];
            if (uVar38 != uVar31) {
              auVar58 = vmaxss_avx(ZEXT416((uint)fVar48),ZEXT416(0));
              fVar48 = auVar58._0_4_;
            }
            pfVar27[uVar30] = fVar48;
            uVar30 = uVar30 + 1;
            pfVar25 = pfVar25 + (int)num_inputs;
          } while (uVar30 != uVar41);
        }
      }
      else {
        uVar39 = ((int)uVar39 >> 3) << 3;
        if (num_inputs + 7 < 0xf) {
          bVar46 = (uVar37 & 7) == 0;
LAB_0049211b:
          bVar47 = (uVar33 & 3) == 0;
          if ((bool)(bVar46 & bVar47)) {
            if (0 < (int)uVar37) {
              lVar29 = (long)(int)uVar39;
              pfVar25 = pfVar25 + lVar29;
              uVar30 = 0;
              do {
                local_500 = *(__m128 *)(local_588 + uVar30 + 4);
                local_540 = *(__m128 *)(local_588 + uVar30);
                lVar40 = lVar29;
                pfVar34 = pfVar25;
                pfVar45 = local_590 + lVar29;
                if ((int)uVar39 < (int)num_inputs) {
                  do {
                    in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                    in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                    av1_nn_propagate_4to8_sse3(pfVar45,pfVar34,&local_500,&local_540,num_inputs);
                    lVar40 = lVar40 + 4;
                    pfVar34 = pfVar34 + 4;
                    pfVar45 = pfVar45 + 4;
                  } while (lVar40 < (int)num_inputs);
                }
                afVar3 = local_500;
                afVar4 = local_540;
                if (uVar38 != uVar31) {
                  afVar3 = (__m128)vmaxps_avx((undefined1  [16])local_500,ZEXT816(0) << 0x40);
                  afVar4 = (__m128)vmaxps_avx((undefined1  [16])local_540,ZEXT816(0) << 0x40);
                }
                *(__m128 *)(pfVar27 + (uVar30 | 4)) = afVar3;
                *(__m128 *)(pfVar27 + uVar30) = afVar4;
                uVar30 = uVar30 + 8;
                pfVar25 = pfVar25 + (long)(int)num_inputs * 8;
              } while (uVar30 < uVar41);
            }
            goto LAB_00492643;
          }
        }
        else {
          bVar46 = uVar38 != uVar31;
          bVar47 = uVar39 == num_inputs;
          if ((uVar37 & 7) == 0) {
            if (0 < (int)uVar37) {
              iVar44 = 0;
              uVar30 = 0;
              do {
                pfVar34 = local_588 + uVar30;
                fVar48 = *pfVar34;
                fVar6 = pfVar34[1];
                fVar7 = pfVar34[2];
                fVar8 = pfVar34[3];
                fVar9 = pfVar34[4];
                fVar10 = pfVar34[5];
                fVar11 = pfVar34[6];
                fVar12 = pfVar34[7];
                auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar61 = ZEXT1632(ZEXT816(0) << 0x40);
                if (7 < (int)num_inputs) {
                  lVar29 = 0;
                  iVar26 = iVar44;
                  do {
                    pfVar34 = local_590 + lVar29;
                    fVar13 = *pfVar34;
                    fVar14 = pfVar34[1];
                    fVar15 = pfVar34[2];
                    fVar16 = pfVar34[3];
                    fVar17 = pfVar34[4];
                    fVar18 = pfVar34[5];
                    fVar19 = pfVar34[6];
                    lVar40 = 0;
                    iVar42 = iVar26;
                    do {
                      pfVar34 = pfVar25 + iVar42;
                      auVar63._0_4_ = fVar13 * *pfVar34;
                      auVar63._4_4_ = fVar14 * pfVar34[1];
                      auVar63._8_4_ = fVar15 * pfVar34[2];
                      auVar63._12_4_ = fVar16 * pfVar34[3];
                      auVar63._16_4_ = fVar17 * pfVar34[4];
                      auVar63._20_4_ = fVar18 * pfVar34[5];
                      auVar63._28_36_ = in_ZMM3._28_36_;
                      auVar63._24_4_ = fVar19 * pfVar34[6];
                      pfVar34 = pfVar25 + (int)(num_inputs + iVar42);
                      auVar66._0_4_ = fVar13 * *pfVar34;
                      auVar66._4_4_ = fVar14 * pfVar34[1];
                      auVar66._8_4_ = fVar15 * pfVar34[2];
                      auVar66._12_4_ = fVar16 * pfVar34[3];
                      auVar66._16_4_ = fVar17 * pfVar34[4];
                      auVar66._20_4_ = fVar18 * pfVar34[5];
                      auVar66._28_36_ = in_ZMM4._28_36_;
                      auVar66._24_4_ = fVar19 * pfVar34[6];
                      in_ZMM4 = ZEXT3264(auVar66._0_32_);
                      auVar60 = vhaddps_avx(auVar63._0_32_,auVar66._0_32_);
                      in_ZMM3 = ZEXT3264(auVar60);
                      *(undefined1 (*) [32])((long)local_500 + lVar40) = auVar60;
                      iVar42 = iVar42 + num_inputs * 2;
                      lVar40 = lVar40 + 0x20;
                    } while (lVar40 != 0x80);
                    auVar21._16_16_ = auStack_4f0;
                    auVar21._0_4_ = local_500[0];
                    auVar21._4_4_ = local_500[1];
                    auVar21._8_4_ = local_500[2];
                    auVar21._12_4_ = local_500[3];
                    auVar60 = vhaddps_avx(auVar21,local_4e0);
                    auVar2 = vhaddps_avx(local_4c0,local_4a0);
                    in_ZMM3 = ZEXT3264(auVar2);
                    in_ZMM4 = ZEXT3264(CONCAT1616(auVar2._0_16_,auVar60._0_16_));
                    auVar55 = vperm2f128_avx(auVar60,auVar2,0x31);
                    auVar61._0_4_ = auVar57._0_4_ + auVar60._0_4_ + auVar55._0_4_;
                    auVar61._4_4_ = auVar57._4_4_ + auVar60._4_4_ + auVar55._4_4_;
                    auVar61._8_4_ = auVar57._8_4_ + auVar60._8_4_ + auVar55._8_4_;
                    auVar61._12_4_ = auVar57._12_4_ + auVar60._12_4_ + auVar55._12_4_;
                    auVar61._16_4_ = auVar57._16_4_ + auVar2._0_4_ + auVar55._16_4_;
                    auVar61._20_4_ = auVar57._20_4_ + auVar2._4_4_ + auVar55._20_4_;
                    auVar61._24_4_ = auVar57._24_4_ + auVar2._8_4_ + auVar55._24_4_;
                    auVar61._28_4_ = auVar57._28_4_ + auVar2._12_4_ + auVar55._28_4_;
                    auVar57 = ZEXT3264(auVar61);
                    lVar29 = lVar29 + 8;
                    iVar26 = iVar26 + 8;
                  } while (lVar29 < (int)uVar39);
                }
                auVar56._0_4_ = fVar48 + auVar61._0_4_;
                auVar56._4_4_ = fVar6 + auVar61._4_4_;
                auVar56._8_4_ = fVar7 + auVar61._8_4_;
                auVar56._12_4_ = fVar8 + auVar61._12_4_;
                auVar56._16_4_ = fVar9 + auVar61._16_4_;
                auVar56._20_4_ = fVar10 + auVar61._20_4_;
                auVar56._24_4_ = fVar11 + auVar61._24_4_;
                auVar56._28_4_ = fVar12 + auVar61._28_4_;
                if (bVar47 && bVar46) {
                  auVar56 = vmaxps_avx(auVar56,_DAT_00517b80);
                }
                *(undefined1 (*) [32])(pfVar27 + uVar30) = auVar56;
                uVar30 = uVar30 + 8;
                iVar44 = iVar44 + num_inputs * 8;
              } while (uVar30 < uVar41);
            }
            bVar46 = true;
            local_588 = pfVar27;
            goto LAB_0049211b;
          }
          if ((uVar37 & 3) == 0) {
            if (0 < (int)uVar37) {
              uVar30 = 0;
              do {
                pfVar34 = local_588 + uVar30;
                fVar48 = *pfVar34;
                fVar6 = pfVar34[1];
                fVar7 = pfVar34[2];
                fVar8 = pfVar34[3];
                auVar59 = ZEXT816(0) << 0x40;
                if (7 < (int)num_inputs) {
                  lVar29 = 0;
                  auVar58 = auVar59;
                  do {
                    pfVar34 = local_590 + lVar29;
                    fVar9 = *pfVar34;
                    fVar10 = pfVar34[1];
                    fVar11 = pfVar34[2];
                    fVar12 = pfVar34[3];
                    fVar13 = pfVar34[4];
                    fVar14 = pfVar34[5];
                    fVar15 = pfVar34[6];
                    uVar43 = 0;
                    pauVar35 = (undefined1 (*) [32])local_500;
                    bVar24 = true;
                    do {
                      bVar36 = bVar24;
                      iVar44 = (uVar43 | (uint)uVar30) * num_inputs + (int)lVar29;
                      pfVar34 = pfVar25 + iVar44;
                      auVar64._0_4_ = fVar9 * *pfVar34;
                      auVar64._4_4_ = fVar10 * pfVar34[1];
                      auVar64._8_4_ = fVar11 * pfVar34[2];
                      auVar64._12_4_ = fVar12 * pfVar34[3];
                      auVar64._16_4_ = fVar13 * pfVar34[4];
                      auVar64._20_4_ = fVar14 * pfVar34[5];
                      auVar64._28_36_ = in_ZMM3._28_36_;
                      auVar64._24_4_ = fVar15 * pfVar34[6];
                      pfVar34 = pfVar25 + (int)(iVar44 + num_inputs);
                      auVar68._0_4_ = fVar9 * *pfVar34;
                      auVar68._4_4_ = fVar10 * pfVar34[1];
                      auVar68._8_4_ = fVar11 * pfVar34[2];
                      auVar68._12_4_ = fVar12 * pfVar34[3];
                      auVar68._16_4_ = fVar13 * pfVar34[4];
                      auVar68._20_4_ = fVar14 * pfVar34[5];
                      auVar68._28_36_ = in_ZMM4._28_36_;
                      auVar68._24_4_ = fVar15 * pfVar34[6];
                      in_ZMM4 = ZEXT3264(auVar68._0_32_);
                      auVar60 = vhaddps_avx(auVar64._0_32_,auVar68._0_32_);
                      in_ZMM3 = ZEXT3264(auVar60);
                      *pauVar35 = auVar60;
                      uVar43 = 2;
                      pauVar35 = (undefined1 (*) [32])local_540;
                      bVar24 = false;
                    } while (bVar36);
                    auVar23._16_16_ = auStack_4f0;
                    auVar23._0_4_ = local_500[0];
                    auVar23._4_4_ = local_500[1];
                    auVar23._8_4_ = local_500[2];
                    auVar23._12_4_ = local_500[3];
                    auVar20._16_16_ = auStack_530;
                    auVar20._0_4_ = local_540[0];
                    auVar20._4_4_ = local_540[1];
                    auVar20._8_4_ = local_540[2];
                    auVar20._12_4_ = local_540[3];
                    auVar60 = vhaddps_avx(auVar23,auVar20);
                    in_ZMM3 = ZEXT1664(auVar60._16_16_);
                    auVar59._0_4_ = auVar58._0_4_ + auVar60._0_4_ + auVar60._16_4_;
                    auVar59._4_4_ = auVar58._4_4_ + auVar60._4_4_ + auVar60._20_4_;
                    auVar59._8_4_ = auVar58._8_4_ + auVar60._8_4_ + auVar60._24_4_;
                    auVar59._12_4_ = auVar58._12_4_ + auVar60._12_4_ + auVar60._28_4_;
                    lVar29 = lVar29 + 8;
                    auVar58 = auVar59;
                  } while (lVar29 < (int)uVar39);
                }
                auVar52._0_4_ = fVar48 + auVar59._0_4_;
                auVar52._4_4_ = fVar6 + auVar59._4_4_;
                auVar52._8_4_ = fVar7 + auVar59._8_4_;
                auVar52._12_4_ = fVar8 + auVar59._12_4_;
                if (bVar47 && bVar46) {
                  auVar52 = vmaxps_avx(auVar52,_DAT_004c9010);
                }
                *(undefined1 (*) [16])(pfVar27 + uVar30) = auVar52;
                uVar30 = uVar30 + 4;
              } while (uVar30 < uVar41);
            }
          }
          else if (0 < (int)uVar37) {
            uVar30 = 0;
            pfVar34 = pfVar25;
            do {
              auVar57 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar54 = ZEXT1632(ZEXT816(0) << 0x40);
              if (7 < (int)num_inputs) {
                lVar29 = 0;
                do {
                  pfVar45 = local_590 + lVar29;
                  pfVar1 = pfVar34 + lVar29;
                  auVar54._0_4_ = auVar57._0_4_ + *pfVar45 * *pfVar1;
                  auVar54._4_4_ = auVar57._4_4_ + pfVar45[1] * pfVar1[1];
                  auVar54._8_4_ = auVar57._8_4_ + pfVar45[2] * pfVar1[2];
                  auVar54._12_4_ = auVar57._12_4_ + pfVar45[3] * pfVar1[3];
                  auVar54._16_4_ = auVar57._16_4_ + pfVar45[4] * pfVar1[4];
                  auVar54._20_4_ = auVar57._20_4_ + pfVar45[5] * pfVar1[5];
                  auVar54._24_4_ = auVar57._24_4_ + pfVar45[6] * pfVar1[6];
                  auVar54._28_4_ = auVar57._28_4_ + pfVar45[7];
                  auVar57 = ZEXT3264(auVar54);
                  lVar29 = lVar29 + 8;
                } while (lVar29 < (int)uVar39);
              }
              auVar50._0_4_ = auVar54._0_4_ + auVar54._16_4_;
              auVar50._4_4_ = auVar54._4_4_ + auVar54._20_4_;
              auVar50._8_4_ = auVar54._8_4_ + auVar54._24_4_;
              auVar50._12_4_ = auVar54._12_4_ + auVar54._28_4_;
              auVar58 = vhaddps_avx(auVar50,auVar50);
              auVar58 = vhaddps_avx(auVar58,auVar58);
              fVar48 = auVar58._0_4_ + local_588[uVar30];
              if (bVar47 && bVar46) {
                auVar58 = vmaxss_avx(ZEXT416((uint)fVar48),ZEXT416(0));
                fVar48 = auVar58._0_4_;
              }
              pfVar27[uVar30] = fVar48;
              uVar30 = uVar30 + 1;
              pfVar34 = pfVar34 + (int)num_inputs;
            } while (uVar30 != uVar41);
          }
          bVar47 = (uVar33 & 3) == 0;
          local_588 = pfVar27;
        }
        if ((bVar47) && ((uVar37 & 3) == 0)) {
          if (0 < (int)uVar37) {
            lVar29 = (long)(int)uVar39;
            pfVar25 = pfVar25 + lVar29;
            uVar30 = 0;
            do {
              local_500 = *(__m128 *)(local_588 + uVar30);
              lVar40 = lVar29;
              pfVar34 = pfVar25;
              pfVar45 = local_590 + lVar29;
              if ((int)uVar39 < (int)num_inputs) {
                do {
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                  av1_nn_propagate_4to4_sse3(pfVar45,pfVar34,&local_500,num_inputs);
                  lVar40 = lVar40 + 4;
                  pfVar34 = pfVar34 + 4;
                  pfVar45 = pfVar45 + 4;
                } while (lVar40 < (int)num_inputs);
              }
              afVar3 = local_500;
              if (uVar38 != uVar31) {
                afVar3 = (__m128)vmaxps_avx((undefined1  [16])local_500,_DAT_004c9010);
              }
              *(__m128 *)(pfVar27 + uVar30) = afVar3;
              uVar30 = uVar30 + 4;
              pfVar25 = pfVar25 + (long)(int)num_inputs * 4;
            } while (uVar30 < uVar41);
          }
        }
        else if (bVar47) {
          if (0 < (int)uVar37) {
            lVar29 = (long)(int)uVar39;
            pfVar25 = pfVar25 + lVar29;
            uVar30 = 0;
            do {
              fVar48 = local_588[uVar30];
              local_500[1] = fVar48;
              local_500[0] = fVar48;
              local_500[2] = fVar48;
              local_500[3] = fVar48;
              lVar40 = lVar29;
              pfVar34 = pfVar25;
              pfVar45 = local_590 + lVar29;
              if ((int)uVar39 < (int)num_inputs) {
                do {
                  in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
                  in_ZMM4 = ZEXT1664(in_ZMM4._0_16_);
                  av1_nn_propagate_4to1_sse3(pfVar45,pfVar34,&local_500);
                  lVar40 = lVar40 + 4;
                  pfVar34 = pfVar34 + 4;
                  pfVar45 = pfVar45 + 4;
                } while (lVar40 < (int)num_inputs);
              }
              afVar3 = local_500;
              if (uVar38 != uVar31) {
                afVar3 = (__m128)vmaxps_avx((undefined1  [16])local_500,_DAT_004c9010);
              }
              pfVar27[uVar30] = afVar3[0];
              uVar30 = uVar30 + 1;
              pfVar25 = pfVar25 + (int)num_inputs;
            } while (uVar30 != uVar41);
          }
        }
        else if (0 < (int)uVar37) {
          uVar30 = 0;
          do {
            fVar48 = local_588[uVar30];
            auVar57 = ZEXT1664(CONCAT412(fVar48,CONCAT48(fVar48,CONCAT44(fVar48,fVar48))));
            lVar29 = (long)(int)uVar39;
            if ((int)uVar39 < (int)num_inputs) {
              do {
                fVar48 = local_590[lVar29] * pfVar25[lVar29];
                auVar57 = ZEXT1664(CONCAT412(auVar57._12_4_ + fVar48,
                                             CONCAT48(auVar57._8_4_ + fVar48,
                                                      CONCAT44(auVar57._4_4_ + fVar48,
                                                               auVar57._0_4_ + fVar48))));
                lVar29 = lVar29 + 1;
              } while ((int)num_inputs != lVar29);
            }
            if (uVar38 != uVar31) {
              auVar58 = vmaxps_avx(auVar57._0_16_,_DAT_004c9010);
              auVar57 = ZEXT1664(auVar58);
            }
            pfVar27[uVar30] = auVar57._0_4_;
            uVar30 = uVar30 + 1;
            pfVar25 = pfVar25 + (int)num_inputs;
          } while (uVar30 != uVar41);
        }
      }
LAB_00492643:
      uVar31 = (ulong)local_468->num_hidden_layers;
      uVar32 = (ulong)(1 - local_50c);
      bVar46 = (long)uVar38 < (long)uVar31;
      nn_config = local_468;
      uVar38 = uVar38 + 1;
      uVar30 = uVar41;
      local_590 = pfVar27;
    } while (bVar46);
  }
  if (local_510 != 0) {
    av1_nn_output_prec_reduce(local_508,nn_config->num_outputs);
  }
  return;
}

Assistant:

void av1_nn_predict_avx2(const float *input_nodes,
                         const NN_CONFIG *const nn_config, int reduce_prec,
                         float *const output) {
  float buf[2][NN_MAX_NODES_PER_LAYER];
  int buf_index = 0;
  int num_inputs = nn_config->num_inputs;
  assert(num_inputs > 0 && num_inputs <= NN_MAX_NODES_PER_LAYER);

  for (int layer = 0; layer <= nn_config->num_hidden_layers; layer++) {
    const float *layer_weights = nn_config->weights[layer];
    const float *layer_bias = nn_config->bias[layer];
    bool is_output_layer = layer == nn_config->num_hidden_layers;
    float *const output_nodes = is_output_layer ? output : &buf[buf_index][0];
    const int num_outputs = is_output_layer
                                ? nn_config->num_outputs
                                : nn_config->num_hidden_nodes[layer];
    assert(num_outputs > 0 && num_outputs <= NN_MAX_NODES_PER_LAYER);

    // Process input multiple of 8 using AVX2 intrinsic.
    if (num_inputs % 8 == 0) {
      nn_propagate_input_multiple_of_8(input_nodes, layer_weights, layer_bias,
                                       num_inputs, num_inputs, is_output_layer,
                                       num_outputs, output_nodes);
    } else {
      // When number of inputs is not multiple of 8, use hybrid approach of AVX2
      // and SSE3 based on the need.
      const int in_mul_8 = num_inputs / 8;
      const int num_inputs_to_process = in_mul_8 * 8;
      int bias_is_considered = 0;
      if (in_mul_8) {
        nn_propagate_input_multiple_of_8(
            input_nodes, layer_weights, layer_bias, num_inputs_to_process,
            num_inputs, is_output_layer, num_outputs, output_nodes);
        bias_is_considered = 1;
      }

      const float *out_temp = bias_is_considered ? output_nodes : layer_bias;
      const int input_remaining = num_inputs % 8;
      if (input_remaining % 4 == 0 && num_outputs % 8 == 0) {
        for (int out = 0; out < num_outputs; out += 8) {
          __m128 out_h = _mm_loadu_ps(&out_temp[out + 4]);
          __m128 out_l = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to8_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &out_h, &out_l, num_inputs);
          }
          if (!is_output_layer) {
            const __m128 zero = _mm_setzero_ps();
            out_h = _mm_max_ps(out_h, zero);
            out_l = _mm_max_ps(out_l, zero);
          }
          _mm_storeu_ps(&output_nodes[out + 4], out_h);
          _mm_storeu_ps(&output_nodes[out], out_l);
        }
      } else if (input_remaining % 4 == 0 && num_outputs % 4 == 0) {
        for (int out = 0; out < num_outputs; out += 4) {
          __m128 outputs = _mm_loadu_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to4_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs, num_inputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          _mm_storeu_ps(&output_nodes[out], outputs);
        }
      } else if (input_remaining % 4 == 0) {
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in = in_mul_8 * 8; in < num_inputs; in += 4) {
            av1_nn_propagate_4to1_sse3(&input_nodes[in],
                                       &layer_weights[out * num_inputs + in],
                                       &outputs);
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      } else {
        // Use SSE instructions for scalar operations to avoid the latency
        // of swapping between SIMD and FPU modes.
        for (int out = 0; out < num_outputs; out++) {
          __m128 outputs = _mm_load1_ps(&out_temp[out]);
          for (int in_node = in_mul_8 * 8; in_node < num_inputs; in_node++) {
            __m128 input = _mm_load1_ps(&input_nodes[in_node]);
            __m128 weight =
                _mm_load1_ps(&layer_weights[num_inputs * out + in_node]);
            outputs = _mm_add_ps(outputs, _mm_mul_ps(input, weight));
          }
          if (!is_output_layer) outputs = _mm_max_ps(outputs, _mm_setzero_ps());
          output_nodes[out] = _mm_cvtss_f32(outputs);
        }
      }
    }
    // Before processing the next layer, treat the output of current layer as
    // input to next layer.
    input_nodes = output_nodes;
    num_inputs = num_outputs;
    buf_index = 1 - buf_index;
  }
  if (reduce_prec) av1_nn_output_prec_reduce(output, nn_config->num_outputs);
}